

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeCodeData.cpp
# Opt level: O1

char16 * NativeCodeData::GetDataDescription(void *data,JitArenaAllocator *alloc)

{
  ulong uVar1;
  short sVar2;
  DataChunk *pDVar3;
  size_t sVar4;
  ulong uVar5;
  long lVar6;
  char16 *pcVar7;
  size_t byteSize;
  ulong uVar8;
  WCHAR local_828 [4];
  char16 buf [1024];
  
  pDVar3 = GetDataChunk(data);
  memset((WCHAR (*) [1024])local_828,0,0x800);
  swprintf_s<1024ul>((WCHAR (*) [1024])local_828,
                     L"%hs, NativeCodeData: index: %x, len: %x, offset: +%x",pDVar3->dataType,
                     (ulong)pDVar3->allocIndex,(ulong)pDVar3->len,(ulong)pDVar3->offset);
  sVar4 = PAL_wcslen((char16_t *)local_828);
  pcVar7 = (char16 *)&DAT_00000008;
  uVar8 = sVar4 + 1;
  if (uVar8 != 0) {
    byteSize = 0xffffffffffffffff;
    if (-1 < (long)uVar8) {
      byteSize = uVar8 * 2;
    }
    pcVar7 = (char16 *)new__<Memory::JitArenaAllocator>(byteSize,alloc,0x3f1274);
  }
  if (pcVar7 != (char16 *)0x0 && uVar8 != 0) {
    lVar6 = 0;
    uVar5 = uVar8;
    do {
      sVar2 = *(short *)((long)local_828 + lVar6);
      *(short *)((long)pcVar7 + lVar6) = sVar2;
      if (sVar2 == 0) goto LAB_005fb944;
      lVar6 = lVar6 + 2;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
    uVar5 = 0;
LAB_005fb944:
    if (uVar5 != 0) {
      uVar1 = (uVar8 - uVar5) + 1;
      if (uVar8 <= uVar1) {
        return pcVar7;
      }
      memset(pcVar7 + uVar1,0xfd,(sVar4 - (uVar8 - uVar5)) * 2);
      return pcVar7;
    }
    *pcVar7 = L'\0';
    if (1 < uVar8) {
      memset(pcVar7 + 1,0xfd,uVar8 * 2 - 2);
    }
  }
  RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
  return pcVar7;
}

Assistant:

char16*
NativeCodeData::GetDataDescription(void* data, JitArenaAllocator * alloc)
{
    auto chunk = GetDataChunk(data);
    char16 buf[1024] = { 0 };
#if DBG
    swprintf_s(buf, _u("%hs, NativeCodeData: index: %x, len: %x, offset: +%x"), chunk->dataType, chunk->allocIndex, chunk->len, chunk->offset);
#else
    swprintf_s(buf, _u("NativeCodeData: index: %x, len: %x, offset: +%x"), chunk->allocIndex, chunk->len, chunk->offset);
#endif
    auto len = wcslen(buf) + 1;
    auto desc = JitAnewArray(alloc, char16, len);
    wcscpy_s(desc, len, buf);
    return desc;
}